

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void __thiscall comparer_context::cmp_bounds<aiVector3t<float>>(comparer_context *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,name,".<minimum-value>");
  cmp<aiVector3t<float>>(this,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  std::operator+(&bStack_38,name,".<maximum-value>");
  cmp<aiVector3t<float>>(this,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

void cmp_bounds(const std::string& name) {
        cmp<T> (name+".<minimum-value>");
        cmp<T> (name+".<maximum-value>");
    }